

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O0

int setup_sparse_fiemap(archive_read_disk *a,archive_entry *entry,int *fd)

{
  bool bVar1;
  mode_t mVar2;
  int iVar3;
  la_int64_t lVar4;
  char *pcVar5;
  int *piVar6;
  ulong uVar7;
  ulong local_1068;
  int64_t length;
  int r;
  int i;
  char *path;
  int exit_sts;
  int iters;
  int do_fiemap;
  int count;
  int64_t size;
  fiemap_extent *fe;
  fiemap *fm;
  char buff [4096];
  int *fd_local;
  archive_entry *entry_local;
  archive_read_disk *a_local;
  
  buff._4088_8_ = fd;
  mVar2 = archive_entry_filetype(entry);
  if (((mVar2 != 0x8000) || (lVar4 = archive_entry_size(entry), lVar4 < 1)) ||
     (pcVar5 = archive_entry_hardlink(entry), pcVar5 != (char *)0x0)) {
    return 0;
  }
  if (*(int *)buff._4088_8_ < 0) {
    pcVar5 = archive_read_disk_entry_setup_path(a,entry,(int *)0x0);
    if (pcVar5 == (char *)0x0) {
      return -0x19;
    }
    if (a->tree == (tree *)0x0) {
      iVar3 = open(pcVar5,0x80800);
      *(int *)buff._4088_8_ = iVar3;
    }
    else {
      iVar3 = (*a->open_on_current_dir)(a->tree,pcVar5,0x80800);
      *(int *)buff._4088_8_ = iVar3;
    }
    if (*(int *)buff._4088_8_ < 0) {
      piVar6 = __errno_location();
      archive_set_error(&a->archive,*piVar6,"Can\'t open `%s\'",pcVar5);
      return -0x19;
    }
    __archive_ensure_cloexec_flag(*(int *)buff._4088_8_);
  }
  memset(&fm,0,0x1000);
  fm = (fiemap *)0x0;
  buff[0] = -1;
  buff[1] = -1;
  buff[2] = -1;
  buff[3] = -1;
  buff[4] = -1;
  buff[5] = -1;
  buff[6] = -1;
  buff[7] = -1;
  buff[8] = '\x01';
  buff[9] = '\0';
  buff[10] = '\0';
  buff[0xb] = '\0';
  buff[0x10] = 'H';
  buff[0x11] = '\0';
  buff[0x12] = '\0';
  buff[0x13] = '\0';
  bVar1 = true;
  uVar7 = archive_entry_size(entry);
  path._4_4_ = 0;
  do {
    iVar3 = ioctl(*(int *)buff._4088_8_,0xc020660b,&fm);
    if (iVar3 < 0) {
      return 0;
    }
    if (buff._12_4_ == 0) {
      if (path._4_4_ != 0) {
        return 0;
      }
      archive_entry_sparse_add_entry(entry,0,0);
      return 0;
    }
    size = (int64_t)(buff + 0x18);
    for (length._4_4_ = 0; length._4_4_ < (int)buff._12_4_; length._4_4_ = length._4_4_ + 1) {
      if ((*(uint *)(size + 0x28) & 0x800) == 0) {
        local_1068 = *(ulong *)(size + 0x10);
        if (uVar7 < *(long *)size + local_1068) {
          local_1068 = local_1068 - ((*(long *)size + local_1068) - uVar7);
        }
        if ((*(long *)size == 0) && (local_1068 == uVar7)) {
          bVar1 = false;
          break;
        }
        if (0 < (long)local_1068) {
          archive_entry_sparse_add_entry(entry,*(la_int64_t *)size,local_1068);
        }
      }
      if ((*(uint *)(size + 0x28) & 1) != 0) {
        bVar1 = false;
      }
      size = size + 0x38;
    }
    if (!bVar1) {
      return 0;
    }
    fm = (fiemap *)
         ((long)(&fe)[(ulong)(uint)buff._12_4_ * 7]->fe_reserved64 +
         *(long *)(&do_fiemap + (ulong)(uint)buff._12_4_ * 0xe) + -0x18);
    path._4_4_ = path._4_4_ + 1;
  } while( true );
}

Assistant:

static int
setup_sparse_fiemap(struct archive_read_disk *a,
    struct archive_entry *entry, int *fd)
{
	char buff[4096];
	struct fiemap *fm;
	struct fiemap_extent *fe;
	int64_t size;
	int count, do_fiemap, iters;
	int exit_sts = ARCHIVE_OK;
	const char *path;

	if (archive_entry_filetype(entry) != AE_IFREG
	    || archive_entry_size(entry) <= 0
	    || archive_entry_hardlink(entry) != NULL)
		return (ARCHIVE_OK);

	if (*fd < 0) {
		path = archive_read_disk_entry_setup_path(a, entry, NULL);
		if (path == NULL)
			return (ARCHIVE_FAILED);

		if (a->tree != NULL)
			*fd = a->open_on_current_dir(a->tree, path,
				O_RDONLY | O_NONBLOCK | O_CLOEXEC);
		else
			*fd = open(path, O_RDONLY | O_NONBLOCK | O_CLOEXEC);
		if (*fd < 0) {
			archive_set_error(&a->archive, errno,
			    "Can't open `%s'", path);
			return (ARCHIVE_FAILED);
		}
		__archive_ensure_cloexec_flag(*fd);
	}

	/* Initialize buffer to avoid the error valgrind complains about. */
	memset(buff, 0, sizeof(buff));
	count = (sizeof(buff) - sizeof(*fm))/sizeof(*fe);
	fm = (struct fiemap *)buff;
	fm->fm_start = 0;
	fm->fm_length = ~0ULL;
	fm->fm_flags = FIEMAP_FLAG_SYNC;
	fm->fm_extent_count = count;
	do_fiemap = 1;
	size = archive_entry_size(entry);
	for (iters = 0; ; ++iters) {
		int i, r;

		r = ioctl(*fd, FS_IOC_FIEMAP, fm); 
		if (r < 0) {
			/* When something error happens, it is better we
			 * should return ARCHIVE_OK because an earlier
			 * version(<2.6.28) cannot perform FS_IOC_FIEMAP. */
			goto exit_setup_sparse_fiemap;
		}
		if (fm->fm_mapped_extents == 0) {
			if (iters == 0) {
				/* Fully sparse file; insert a zero-length "data" entry */
				archive_entry_sparse_add_entry(entry, 0, 0);
			}
			break;
		}
		fe = fm->fm_extents;
		for (i = 0; i < (int)fm->fm_mapped_extents; i++, fe++) {
			if (!(fe->fe_flags & FIEMAP_EXTENT_UNWRITTEN)) {
				/* The fe_length of the last block does not
				 * adjust itself to its size files. */
				int64_t length = fe->fe_length;
				if (fe->fe_logical + length > (uint64_t)size)
					length -= fe->fe_logical + length - size;
				if (fe->fe_logical == 0 && length == size) {
					/* This is not sparse. */
					do_fiemap = 0;
					break;
				}
				if (length > 0)
					archive_entry_sparse_add_entry(entry,
					    fe->fe_logical, length);
			}
			if (fe->fe_flags & FIEMAP_EXTENT_LAST)
				do_fiemap = 0;
		}
		if (do_fiemap) {
			fe = fm->fm_extents + fm->fm_mapped_extents -1;
			fm->fm_start = fe->fe_logical + fe->fe_length;
		} else
			break;
	}
exit_setup_sparse_fiemap:
	return (exit_sts);
}